

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::convertCollisionShape
          (btCollisionWorldImporter *this,btCollisionShapeData *shapeData)

{
  btScalar bVar1;
  int iVar2;
  btCompoundShape *this_00;
  btScalar *pbVar3;
  btVector3 *pbVar4;
  float *pfVar5;
  btTriangleInfoMap *triangleInfoMap;
  btConvexHullShape *pbVar6;
  btTransformFloatData *dataIn;
  bool *_x;
  btCollisionWorldImporter *in_RSI;
  btTransform *in_RDI;
  btVector3 bVar7;
  btTransform localTransform;
  btCollisionShape *childShape_1;
  btCollisionShapeData *cd;
  btCompoundShapeChildData *ptr;
  int i_2;
  btAlignedObjectArray<btCollisionShape_*> childShapes;
  btCompoundShapeChildData *childShapeDataArray;
  btCompoundShape *compoundShape;
  btCompoundShapeData *compoundData;
  btTriangleInfoMap *map;
  btBvhTriangleMeshShape *trimeshShape;
  btOptimizedBvh **bvhPtr_1;
  btOptimizedBvh **bvhPtr;
  btOptimizedBvh *bvh;
  btVector3 scaling;
  btTriangleIndexVertexArray *meshInterface;
  btStridingMeshInterfaceData *interfaceData;
  btTriangleMeshShapeData *trimesh;
  btVector3 localScaling_3;
  btConvexHullShape *hullShape;
  int i_1;
  btAlignedObjectArray<btVector3> tmpPoints;
  int numPoints;
  btConvexHullShapeData *convexData;
  int i;
  btAlignedObjectArray<float> radii;
  btAlignedObjectArray<btVector3> tmpPos;
  int numSpheres;
  btMultiSphereShapeData *mss;
  btVector3 halfExtents_1;
  btConeShapeData *conData;
  btVector3 halfExtents;
  btCylinderShapeData *cylData;
  btBoxShape *box;
  btVector3 margin;
  btVector3 localScaling_2;
  btVector3 implicitShapeDimensions;
  btConvexInternalShapeData *bsd;
  btCapsuleShape *cap;
  btCapsuleShapeData *capData;
  btVector3 localScaling_1;
  btBvhTriangleMeshShape *meshShape;
  btCollisionShape *childShape;
  btCollisionShapeData *colShapeData;
  btScaledTriangleMeshShapeData *scaledMesh;
  btVector3 localScaling;
  btVector3 planeNormal;
  btStaticPlaneShapeData *planeData;
  btCollisionShape *shape;
  btCapsuleShapeData *in_stack_fffffffffffffc48;
  btTransform *in_stack_fffffffffffffc50;
  btHashMap<btHashPtr,_btOptimizedBvh_*> *in_stack_fffffffffffffc58;
  btVector3 *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  btAlignedObjectArray<btVector3> *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  float fVar8;
  btTriangleInfoMap *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  int local_28c;
  btHashPtr local_240;
  btOptimizedBvh **local_238;
  btHashPtr local_230;
  btOptimizedBvh **local_228;
  btOptimizedBvh *local_220;
  btVector3 local_218;
  btStridingMeshInterface *local_208;
  undefined8 local_200;
  btCollisionWorldImporter *local_1f8;
  btVector3 local_1f0;
  btConvexHullShape *local_1e0;
  int local_1d4;
  btVector3 local_1d0;
  btAlignedObjectArray<btVector3> local_1c0;
  int local_19c;
  btCollisionWorldImporter *local_198;
  int local_18c;
  btVector3 local_188;
  undefined4 local_178;
  btAlignedObjectArray<float> local_168;
  btAlignedObjectArray<btVector3> local_148;
  int local_124;
  btCollisionWorldImporter *local_120;
  btVector3 local_118;
  btVector3 local_100;
  btCollisionWorldImporter *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  btConvexHullShape *local_c8;
  btVector3 local_c0;
  btVector3 local_b0;
  btVector3 local_a0;
  btCollisionWorldImporter *local_90;
  btConvexHullShape *local_88;
  btVector3 local_78;
  btCollisionShape *local_68;
  btCollisionShape *local_60;
  btCollisionWorldImporter *local_50;
  btVector3 local_48;
  btVector3 local_38;
  btCollisionWorldImporter *local_28;
  btCollisionWorldImporter *this_01;
  btConvexHullShape *local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_8 = (btConvexHullShape *)0x0;
  this_00 = (btCompoundShape *)(ulong)*(uint *)&in_RSI->m_collisionWorld;
  switch(this_00) {
  case (btCompoundShape *)0x0:
  case (btCompoundShape *)0x4:
  case (btCompoundShape *)0x8:
  case (btCompoundShape *)0x9:
  case (btCompoundShape *)0xb:
  case (btCompoundShape *)0xd:
    local_90 = in_RSI;
    btVector3::btVector3(&local_a0);
    btVector3::deSerializeFloat
              (&local_a0,(btVector3FloatData *)&(local_90->m_allocatedCollisionShapes).m_capacity);
    btVector3::btVector3(&local_b0);
    btVector3::deSerializeFloat(&local_b0,(btVector3FloatData *)&local_90->m_verboseMode);
    _x = &(local_90->m_allocatedCollisionShapes).m_ownsMemory;
    local_f0 = in_RSI;
    btVector3::btVector3(&local_c0,(btScalar *)_x,(btScalar *)_x,(btScalar *)_x);
    switch(*(undefined4 *)&local_f0->m_collisionWorld) {
    case 0:
      bVar7 = operator/(in_stack_fffffffffffffc60,(btVector3 *)in_stack_fffffffffffffc58);
      local_e0 = bVar7.m_floats._8_8_;
      local_e8 = bVar7.m_floats._0_8_;
      bVar7 = operator+(in_stack_fffffffffffffc60,(btVector3 *)in_stack_fffffffffffffc58);
      local_d0 = bVar7.m_floats._8_8_;
      local_d8 = bVar7.m_floats._0_8_;
      local_c8 = (btConvexHullShape *)
                 (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x28))(in_RDI,&local_d8)
      ;
      local_8 = local_c8;
      break;
    default:
      printf("error: cannot create shape type (%d)\n",(ulong)*(uint *)&local_f0->m_collisionWorld);
      break;
    case 4:
      local_198 = local_90;
      local_19c = *(int *)&(local_90->m_allocatedRigidBodies).m_data;
      btAlignedObjectArray<btVector3>::btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffc50);
      btVector3::btVector3(&local_1d0);
      btAlignedObjectArray<btVector3>::resize
                (in_stack_fffffffffffffc70,iVar2,in_stack_fffffffffffffc60);
      for (local_1d4 = 0; local_1d4 < local_19c; local_1d4 = local_1d4 + 1) {
        if (*(long *)&local_198->m_allocatedRigidBodies != 0) {
          pbVar4 = btAlignedObjectArray<btVector3>::operator[](&local_1c0,local_1d4);
          btVector3::deSerialize
                    (pbVar4,(btVector3FloatData *)
                            (*(long *)&local_198->m_allocatedRigidBodies + (long)local_1d4 * 0x10));
        }
        if (*(long *)&(local_198->m_allocatedRigidBodies).m_capacity != 0) {
          pbVar4 = btAlignedObjectArray<btVector3>::operator[](&local_1c0,local_1d4);
          btVector3::deSerializeDouble
                    (pbVar4,(btVector3DoubleData *)
                            (*(long *)&(local_198->m_allocatedRigidBodies).m_capacity +
                            (long)local_1d4 * 0x20));
        }
      }
      local_1e0 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xa0))();
      for (local_1d4 = 0; local_1d4 < local_19c; local_1d4 = local_1d4 + 1) {
        pbVar6 = local_1e0;
        btAlignedObjectArray<btVector3>::operator[](&local_1c0,local_1d4);
        btConvexHullShape::addPoint
                  (pbVar6,(btVector3 *)in_stack_fffffffffffffc58,
                   SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0));
      }
      (*(local_1e0->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])
                (*(undefined4 *)&(local_90->m_allocatedCollisionShapes).m_ownsMemory);
      local_8 = local_1e0;
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)0x185764);
      break;
    case 8:
      pbVar3 = btVector3::getX(&local_a0);
      local_8 = (btConvexHullShape *)
                (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x30))(*pbVar3);
      break;
    case 9:
      local_120 = local_90;
      local_124 = (local_90->m_allocatedRigidBodies).m_capacity;
      btAlignedObjectArray<btVector3>::btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffc50);
      btAlignedObjectArray<float>::btAlignedObjectArray
                ((btAlignedObjectArray<float> *)in_stack_fffffffffffffc50);
      local_178 = 0;
      btAlignedObjectArray<float>::resize
                ((btAlignedObjectArray<float> *)in_stack_fffffffffffffc70,iVar2,
                 in_stack_fffffffffffffc60->m_floats);
      btVector3::btVector3(&local_188);
      btAlignedObjectArray<btVector3>::resize
                (in_stack_fffffffffffffc70,iVar2,in_stack_fffffffffffffc60);
      for (local_18c = 0; local_18c < local_124; local_18c = local_18c + 1) {
        pbVar4 = btAlignedObjectArray<btVector3>::operator[](&local_148,local_18c);
        btVector3::deSerializeFloat
                  (pbVar4,(btVector3FloatData *)
                          (*(long *)&local_120->m_allocatedRigidBodies + (long)local_18c * 0x14));
        fVar8 = *(float *)(*(long *)&local_120->m_allocatedRigidBodies + 0x10 +
                          (long)local_18c * 0x14);
        pfVar5 = btAlignedObjectArray<float>::operator[](&local_168,local_18c);
        *pfVar5 = fVar8;
      }
      pbVar4 = btAlignedObjectArray<btVector3>::operator[](&local_148,0);
      pfVar5 = btAlignedObjectArray<float>::operator[](&local_168,0);
      local_8 = (btConvexHullShape *)
                (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xb8))
                          (in_RDI,pbVar4,pfVar5,local_124);
      btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)0x185506);
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)0x185513);
      break;
    case 0xb:
      local_118.m_floats[0] = local_a0.m_floats[0];
      local_118.m_floats[1] = local_a0.m_floats[1];
      local_118.m_floats[2] = local_a0.m_floats[2];
      local_118.m_floats[3] = local_a0.m_floats[3];
      iVar2 = *(int *)&local_f0->m_allocatedRigidBodies;
      if (iVar2 == 0) {
        pbVar3 = btVector3::getY(&local_118);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getX(&local_118);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x68))(bVar1,*pbVar3);
      }
      else if (iVar2 == 1) {
        pbVar3 = btVector3::getX(&local_118);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getY(&local_118);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x70))(bVar1,*pbVar3);
      }
      else if (iVar2 == 2) {
        pbVar3 = btVector3::getX(&local_118);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getZ(&local_118);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x78))(bVar1,*pbVar3);
      }
      else {
        printf("unknown Cone up axis\n");
      }
      break;
    case 0xd:
      bVar7 = operator+(in_stack_fffffffffffffc60,(btVector3 *)in_stack_fffffffffffffc58);
      local_100.m_floats._8_8_ = bVar7.m_floats._8_8_;
      local_100.m_floats._0_8_ = bVar7.m_floats._0_8_;
      iVar2 = *(int *)&local_f0->m_allocatedRigidBodies;
      if (iVar2 == 0) {
        pbVar3 = btVector3::getY(&local_100);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getX(&local_100);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x50))(bVar1,*pbVar3);
      }
      else if (iVar2 == 1) {
        pbVar3 = btVector3::getX(&local_100);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getY(&local_100);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x58))(bVar1,*pbVar3);
      }
      else if (iVar2 == 2) {
        pbVar3 = btVector3::getX(&local_100);
        bVar1 = *pbVar3;
        pbVar3 = btVector3::getZ(&local_100);
        local_8 = (btConvexHullShape *)
                  (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x60))(bVar1,*pbVar3);
      }
      else {
        printf("unknown Cylinder up axis\n");
      }
    }
    if (local_8 != (btConvexHullShape *)0x0) {
      (*(local_8->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])
                (*(undefined4 *)&(local_90->m_allocatedCollisionShapes).m_ownsMemory);
      btVector3::btVector3(&local_1f0);
      btVector3::deSerializeFloat(&local_1f0,(btVector3FloatData *)&local_90->m_verboseMode);
      (*(local_8->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[6])(local_8,&local_1f0);
    }
    break;
  default:
    break;
  case (btCompoundShape *)0xa:
    iVar2 = *(int *)&in_RSI->m_allocatedRigidBodies;
    if (iVar2 == 0) {
      local_88 = (btConvexHullShape *)
                 (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x38))(0x3f800000);
    }
    else if (iVar2 == 1) {
      local_88 = (btConvexHullShape *)
                 (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x40))(0x3f800000);
    }
    else if (iVar2 == 2) {
      local_88 = (btConvexHullShape *)
                 (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x48))(0x3f800000);
    }
    else {
      printf("error: wrong up axis for btCapsuleShape\n");
      local_88 = local_8;
    }
    local_8 = local_88;
    if (local_88 != (btConvexHullShape *)0x0) {
      btCapsuleShape::deSerializeFloat
                ((btCapsuleShape *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_8 = local_88;
    }
    break;
  case (btCompoundShape *)0x15:
    local_1f8 = in_RSI;
    local_200 = (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x98))
                          (in_RDI,&in_RSI->m_verboseMode);
    local_208 = (btStridingMeshInterface *)
                (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xc0))(in_RDI,local_200);
    iVar2 = (*local_208->_vptr_btStridingMeshInterface[7])();
    if (iVar2 == 0) {
      local_8 = (btConvexHullShape *)0x0;
    }
    else {
      btVector3::btVector3(&local_218);
      btVector3::deSerializeFloat
                (&local_218,(btVector3FloatData *)&local_1f8->m_allocatedCollisionShapes);
      btStridingMeshInterface::setScaling(local_208,&local_218);
      local_220 = (btOptimizedBvh *)0x0;
      if (*(long *)&(local_1f8->m_allocatedCollisionShapes).m_ownsMemory != 0) {
        in_stack_fffffffffffffc58 =
             (btHashMap<btHashPtr,_btOptimizedBvh_*> *)(in_RDI[6].m_origin.m_floats + 2);
        btHashPtr::btHashPtr
                  (&local_230,*(void **)&(local_1f8->m_allocatedCollisionShapes).m_ownsMemory);
        local_228 = btHashMap<btHashPtr,_btOptimizedBvh_*>::find
                              (in_stack_fffffffffffffc58,(btHashPtr *)in_stack_fffffffffffffc50);
        if ((local_228 == (btOptimizedBvh **)0x0) || (*local_228 == (btOptimizedBvh *)0x0)) {
          local_220 = (btOptimizedBvh *)
                      (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 200))();
          (*(local_220->super_btQuantizedBvh)._vptr_btQuantizedBvh[5])
                    (local_220,*(undefined8 *)&(local_1f8->m_allocatedCollisionShapes).m_ownsMemory)
          ;
        }
        else {
          local_220 = *local_228;
        }
      }
      if (*(long *)&local_1f8->m_allocatedRigidBodies != 0) {
        pbVar3 = in_RDI[6].m_origin.m_floats + 2;
        btHashPtr::btHashPtr(&local_240,*(void **)&local_1f8->m_allocatedRigidBodies);
        local_238 = btHashMap<btHashPtr,_btOptimizedBvh_*>::find
                              (in_stack_fffffffffffffc58,(btHashPtr *)pbVar3);
        if ((local_238 == (btOptimizedBvh **)0x0) || (*local_238 == (btOptimizedBvh *)0x0)) {
          local_220 = (btOptimizedBvh *)
                      (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 200))();
          (*(local_220->super_btQuantizedBvh)._vptr_btQuantizedBvh[6])
                    (local_220,*(undefined8 *)&local_1f8->m_allocatedRigidBodies);
        }
        else {
          local_220 = *local_238;
        }
      }
      pbVar6 = (btConvexHullShape *)
               (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x88))
                         (in_RDI,local_208,local_220);
      (*(pbVar6->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xb])(*(undefined4 *)&(local_1f8->m_allocatedRigidBodies).m_data);
      local_8 = pbVar6;
      if (*(long *)&(local_1f8->m_allocatedRigidBodies).m_capacity != 0) {
        triangleInfoMap =
             (btTriangleInfoMap *)
             (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xd0))();
        btTriangleInfoMap::deSerialize
                  (in_stack_fffffffffffffcb0,
                   (btTriangleInfoMapData *)
                   CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        btBvhTriangleMeshShape::setTriangleInfoMap((btBvhTriangleMeshShape *)pbVar6,triangleInfoMap)
        ;
      }
    }
    break;
  case (btCompoundShape *)0x16:
    *(undefined4 *)&in_RSI->m_collisionWorld = 0x15;
    local_50 = in_RSI;
    local_68 = convertCollisionShape(in_RSI,(btCollisionShapeData *)0x0);
    local_60 = local_68;
    btVector3::btVector3(&local_78);
    btVector3::deSerializeFloat
              (&local_78,(btVector3FloatData *)&(local_50->m_allocatedRigidBodies).m_ownsMemory);
    local_8 = (btConvexHullShape *)
              (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xb0))
                        (in_RDI,local_68,&local_78);
    break;
  case (btCompoundShape *)0x1c:
    local_28 = in_RSI;
    btVector3::btVector3(&local_38);
    btVector3::btVector3(&local_48);
    btVector3::deSerializeFloat
              (&local_38,(btVector3FloatData *)&(local_28->m_allocatedCollisionShapes).m_capacity);
    btVector3::deSerializeFloat(&local_48,(btVector3FloatData *)&local_28->m_verboseMode);
    local_8 = (btConvexHullShape *)
              (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0x20))
                        (*(undefined4 *)&(local_28->m_allocatedCollisionShapes).m_ownsMemory,in_RDI,
                         &local_38);
    (*(local_8->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
      super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
      [6])(local_8,&local_48);
    break;
  case (btCompoundShape *)0x1f:
    this_01 = in_RSI;
    pbVar6 = (btConvexHullShape *)
             (**(code **)(*(long *)(in_RDI->m_basis).m_el[0].m_floats + 0xa8))();
    btAlignedObjectArray<btCollisionShape_*>::btAlignedObjectArray
              ((btAlignedObjectArray<btCollisionShape_*> *)in_stack_fffffffffffffc50);
    for (local_28c = 0; local_28c < *(int *)&in_RSI->m_allocatedCollisionShapes;
        local_28c = local_28c + 1) {
      dataIn = (btTransformFloatData *)
               convertCollisionShape(this_01,(btCollisionShapeData *)local_8);
      if (dataIn != (btTransformFloatData *)0x0) {
        btTransform::btTransform(in_stack_fffffffffffffc50);
        btTransform::deSerializeFloat(in_stack_fffffffffffffc50,dataIn);
        btCompoundShape::addChildShape
                  (this_00,in_RDI,
                   (btCollisionShape *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
                  );
      }
    }
    btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btCollisionShape_*> *)0x185c7d);
    local_8 = pbVar6;
    break;
  case (btCompoundShape *)0x20:
    local_8 = (btConvexHullShape *)0x0;
  }
  return (btCollisionShape *)local_8;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::convertCollisionShape(  btCollisionShapeData* shapeData  )
{
	btCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
		{
	case STATIC_PLANE_PROXYTYPE:
		{
			btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*)shapeData;
			btVector3 planeNormal,localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal,planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
	case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btScaledTriangleMeshShapeData* scaledMesh = (btScaledTriangleMeshShapeData*) shapeData;
			btCollisionShapeData* colShapeData = (btCollisionShapeData*) &scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			btCollisionShape* childShape = convertCollisionShape(colShapeData);
			btBvhTriangleMeshShape* meshShape = (btBvhTriangleMeshShape*)childShape;
			btVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
	case GIMPACT_SHAPE_PROXYTYPE:
		{
			btGImpactMeshShapeData* gimpactData = (btGImpactMeshShapeData*) shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);


				btGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				btVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(btScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			} else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif //SUPPORT_GIMPACT_SHAPE_IMPORT
	//The btCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API
	//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			btCapsuleShapeData* capData = (btCapsuleShapeData*)shapeData;


			switch (capData->m_upAxis)
			{
			case 0:
				{
					shape = createCapsuleShapeX(1,1);
					break;
				}
			case 1:
				{
					shape = createCapsuleShapeY(1,1);
					break;
				}
			case 2:
				{
					shape = createCapsuleShapeZ(1,1);
					break;
				}
			default:
				{
					printf("error: wrong up axis for btCapsuleShape\n");
				}


			};
			if (shape)
			{
				btCapsuleShape* cap = (btCapsuleShape*) shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
			{
				btConvexInternalShapeData* bsd = (btConvexInternalShapeData*)shapeData;
				btVector3 implicitShapeDimensions;
				implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
				btVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				btVector3 margin(bsd->m_collisionMargin,bsd->m_collisionMargin,bsd->m_collisionMargin);
				switch (shapeData->m_shapeType)
				{
					case BOX_SHAPE_PROXYTYPE:
						{
							btBoxShape* box= (btBoxShape*)createBoxShape(implicitShapeDimensions/localScaling+margin);
							//box->initializePolyhedralFeatures();
							shape = box;

							break;
						}
					case SPHERE_SHAPE_PROXYTYPE:
						{
							shape = createSphereShape(implicitShapeDimensions.getX());
							break;
						}

					case CYLINDER_SHAPE_PROXYTYPE:
						{
							btCylinderShapeData* cylData = (btCylinderShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions+margin;
							switch (cylData->m_upAxis)
							{
							case 0:
								{
									shape = createCylinderShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createCylinderShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createCylinderShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cylinder up axis\n");
								}

							};



							break;
						}
					case CONE_SHAPE_PROXYTYPE:
						{
							btConeShapeData* conData = (btConeShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions;//+margin;
							switch (conData->m_upIndex)
							{
							case 0:
								{
									shape = createConeShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createConeShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createConeShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cone up axis\n");
								}

							};



							break;
						}
					case MULTI_SPHERE_SHAPE_PROXYTYPE:
						{
							btMultiSphereShapeData* mss = (btMultiSphereShapeData*)bsd;
							int numSpheres = mss->m_localPositionArraySize;

							btAlignedObjectArray<btVector3> tmpPos;
							btAlignedObjectArray<btScalar> radii;
							radii.resize(numSpheres);
							tmpPos.resize(numSpheres);
							int i;
							for ( i=0;i<numSpheres;i++)
							{
								tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
								radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
							}
							shape = createMultiSphereShape(&tmpPos[0],&radii[0],numSpheres);
							break;
						}
					case CONVEX_HULL_SHAPE_PROXYTYPE:
						{
						//	int sz = sizeof(btConvexHullShapeData);
						//	int sz2 = sizeof(btConvexInternalShapeData);
						//	int sz3 = sizeof(btCollisionShapeData);
							btConvexHullShapeData* convexData = (btConvexHullShapeData*)bsd;
							int numPoints = convexData->m_numUnscaledPoints;

							btAlignedObjectArray<btVector3> tmpPoints;
							tmpPoints.resize(numPoints);
							int i;
							for ( i=0;i<numPoints;i++)
							{
#ifdef BT_USE_DOUBLE_PRECISION
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif //BT_USE_DOUBLE_PRECISION
							}
							btConvexHullShape* hullShape = createConvexHullShape();
							for (i=0;i<numPoints;i++)
							{
								hullShape->addPoint(tmpPoints[i]);
							}
							hullShape->setMargin(bsd->m_collisionMargin);
							//hullShape->initializePolyhedralFeatures();
							shape = hullShape;
							break;
						}
					default:
						{
							printf("error: cannot create shape type (%d)\n",shapeData->m_shapeType);
						}
				}

				if (shape)
				{
					shape->setMargin(bsd->m_collisionMargin);

					btVector3 localScaling;
					localScaling.deSerializeFloat(bsd->m_localScaling);
					shape->setLocalScaling(localScaling);

				}
				break;
			}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btTriangleMeshShapeData* trimesh = (btTriangleMeshShapeData*)shapeData;
			btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			btVector3 scaling; scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);


			btOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif


			btBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface,bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				btTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = btAdjustInternalEdgeContactsCallback;
#endif //USE_INTERNAL_EDGE_UTILITY

			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
			{
				btCompoundShapeData* compoundData = (btCompoundShapeData*)shapeData;
				btCompoundShape* compoundShape = createCompoundShape();

				btCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];


				btAlignedObjectArray<btCollisionShape*> childShapes;
				for (int i=0;i<compoundData->m_numChildShapes;i++)
				{
					btCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

					btCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

					btCollisionShape* childShape = convertCollisionShape(cd);
					if (childShape)
					{
						btTransform localTransform;
						localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
						compoundShape->addChildShape(localTransform,childShape);
					} else
					{
#ifdef _DEBUG
						printf("error: couldn't create childShape for compoundShape\n");
#endif
					}

				}
				shape = compoundShape;

				break;
			}
		case SOFTBODY_SHAPE_PROXYTYPE:
			{
				return 0;
			}
		default:
			{
#ifdef _DEBUG
				printf("unsupported shape type (%d)\n",shapeData->m_shapeType);
#endif
			}
		}

		return shape;

}